

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3SchemaClear(void *p)

{
  HashElem *pHVar1;
  long in_FS_OFFSET;
  sqlite3 xdb;
  Hash local_378;
  Hash local_358;
  sqlite3 local_338;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&local_338,&DAT_00204240,0x310);
  memset(&local_338,0,0x310);
  local_358._0_8_ = *(undefined8 *)((long)p + 8);
  local_358.first = *(HashElem **)((long)p + 0x10);
  local_358.ht = *(_ht **)((long)p + 0x18);
  local_378.ht = *(_ht **)((long)p + 0x48);
  local_378._0_8_ = *(undefined8 *)((long)p + 0x38);
  local_378.first = *(HashElem **)((long)p + 0x40);
  *(undefined8 *)((long)p + 0x38) = 0;
  *(undefined8 *)((long)p + 0x40) = 0;
  *(undefined8 *)((long)p + 0x48) = 0;
  sqlite3HashClear((Hash *)((long)p + 0x20));
  if (local_378.first != (HashElem *)0x0) {
    pHVar1 = local_378.first;
    do {
      sqlite3DeleteTrigger(&local_338,(Trigger *)pHVar1->data);
      pHVar1 = pHVar1->next;
    } while (pHVar1 != (HashElem *)0x0);
  }
  sqlite3HashClear(&local_378);
  *(undefined8 *)((long)p + 8) = 0;
  *(undefined8 *)((long)p + 0x10) = 0;
  *(undefined8 *)((long)p + 0x18) = 0;
  if (local_358.first != (HashElem *)0x0) {
    pHVar1 = local_358.first;
    do {
      sqlite3DeleteTable(&local_338,(Table *)pHVar1->data);
      pHVar1 = pHVar1->next;
    } while (pHVar1 != (HashElem *)0x0);
  }
  sqlite3HashClear(&local_358);
  sqlite3HashClear((Hash *)((long)p + 0x50));
  *(undefined8 *)((long)p + 0x68) = 0;
  if ((*(ushort *)((long)p + 0x72) & 1) != 0) {
    *(int *)((long)p + 4) = *(int *)((long)p + 4) + 1;
  }
  *(ushort *)((long)p + 0x72) = *(ushort *)((long)p + 0x72) & 0xfff6;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3SchemaClear(void *p){
  Hash temp1;
  Hash temp2;
  HashElem *pElem;
  Schema *pSchema = (Schema *)p;
  sqlite3 xdb;

  memset(&xdb, 0, sizeof(xdb));
  temp1 = pSchema->tblHash;
  temp2 = pSchema->trigHash;
  sqlite3HashInit(&pSchema->trigHash);
  sqlite3HashClear(&pSchema->idxHash);
  for(pElem=sqliteHashFirst(&temp2); pElem; pElem=sqliteHashNext(pElem)){
    sqlite3DeleteTrigger(&xdb, (Trigger*)sqliteHashData(pElem));
  }
  sqlite3HashClear(&temp2);
  sqlite3HashInit(&pSchema->tblHash);
  for(pElem=sqliteHashFirst(&temp1); pElem; pElem=sqliteHashNext(pElem)){
    Table *pTab = sqliteHashData(pElem);
    sqlite3DeleteTable(&xdb, pTab);
  }
  sqlite3HashClear(&temp1);
  sqlite3HashClear(&pSchema->fkeyHash);
  pSchema->pSeqTab = 0;
  if( pSchema->schemaFlags & DB_SchemaLoaded ){
    pSchema->iGeneration++;
  }
  pSchema->schemaFlags &= ~(DB_SchemaLoaded|DB_ResetWanted);
}